

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binarymodelserialiser.cpp
# Opt level: O2

bool __thiscall
BinaryModelSerialiserPrivate::readBinaryElement
          (BinaryModelSerialiserPrivate *this,QDataStream *source,QModelIndex *parent)

{
  QAbstractItemModel *pQVar1;
  QModelIndex *pQVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  QDataStream *this_00;
  bool hasChild;
  qint32 colCount;
  qint32 rowCount;
  qint32 tempRole;
  QVariant tempData;
  QModelIndex currIdx;
  bool local_81;
  int local_80;
  int local_7c;
  int local_78;
  int local_74;
  QModelIndex *local_70;
  anon_union_24_3_e3d07ef4_for_data local_68;
  undefined8 local_50;
  QModelIndex local_48;
  
  this_00 = (QDataStream *)QDataStream::operator>>(source,&local_7c);
  QDataStream::operator>>(this_00,&local_80);
  pQVar1 = (this->super_AbstractModelSerialiserPrivate).m_model;
  bVar3 = false;
  (**(code **)(*(long *)pQVar1 + 0xf8))(pQVar1,0,local_7c,parent);
  pQVar1 = (this->super_AbstractModelSerialiserPrivate).m_model;
  (**(code **)(*(long *)pQVar1 + 0x100))(pQVar1,0,local_80,parent);
  pQVar1 = (this->super_AbstractModelSerialiserPrivate).m_model;
  iVar4 = (**(code **)(*(long *)pQVar1 + 0x78))(pQVar1,parent);
  if (iVar4 == local_7c) {
    pQVar1 = (this->super_AbstractModelSerialiserPrivate).m_model;
    iVar4 = (**(code **)(*(long *)pQVar1 + 0x80))(pQVar1,parent);
    iVar5 = 0;
    bVar3 = false;
    if (iVar4 == local_80) {
      local_74 = -1;
      local_68.shared = (PrivateShared *)0x0;
      local_68._8_8_ = 0;
      local_68._16_8_ = 0;
      local_50 = 2;
      local_81 = false;
      local_70 = parent;
      while (iVar5 < local_7c) {
        iVar4 = QDataStream::status();
        if (iVar4 != 0) break;
        local_78 = iVar5;
        for (iVar4 = 0; iVar4 < local_80; iVar4 = iVar4 + 1) {
          iVar5 = QDataStream::status();
          if (iVar5 != 0) break;
          pQVar1 = (this->super_AbstractModelSerialiserPrivate).m_model;
          (**(code **)(*(long *)pQVar1 + 0x60))(&local_48,pQVar1,local_78,iVar4,local_70);
          QDataStream::operator>>(source,&local_74);
          while (local_74 != -1) {
            iVar5 = QDataStream::status();
            if (iVar5 != 0) break;
            ::operator>>(source,(QVariant *)&local_68);
            iVar5 = QDataStream::status();
            if (iVar5 != 0) break;
            pQVar1 = (this->super_AbstractModelSerialiserPrivate).m_model;
            (**(code **)(*(long *)pQVar1 + 0x98))(pQVar1,&local_48,&local_68,local_74);
            QDataStream::operator>>(source,&local_74);
          }
          iVar5 = QDataStream::status();
          if (iVar5 == 0) {
            QDataStream::operator>>(source,&local_81);
          }
          iVar5 = QDataStream::status();
          if (iVar5 != 0) break;
          if (local_81 == true) {
            bVar3 = readBinaryElement(this,source,&local_48);
            pQVar2 = local_70;
            if (!bVar3) {
              pQVar1 = (this->super_AbstractModelSerialiserPrivate).m_model;
              (**(code **)(*(long *)pQVar1 + 0x108))(pQVar1,0,local_7c,local_70);
              pQVar1 = (this->super_AbstractModelSerialiserPrivate).m_model;
              (**(code **)(*(long *)pQVar1 + 0x110))(pQVar1,0,local_80,pQVar2);
              bVar3 = false;
              goto LAB_00122611;
            }
          }
        }
        iVar5 = local_78 + 1;
      }
      iVar4 = QDataStream::status();
      if (iVar4 == 0) {
        bVar3 = true;
      }
      else {
        pQVar1 = (this->super_AbstractModelSerialiserPrivate).m_model;
        (**(code **)(*(long *)pQVar1 + 0x108))(pQVar1,0,local_7c,local_70);
        pQVar1 = (this->super_AbstractModelSerialiserPrivate).m_model;
        bVar3 = false;
        (**(code **)(*(long *)pQVar1 + 0x110))(pQVar1,0,local_80,local_70);
      }
LAB_00122611:
      ::QVariant::~QVariant((QVariant *)&local_68);
    }
  }
  return bVar3;
}

Assistant:

bool BinaryModelSerialiserPrivate::readBinaryElement(QDataStream &source, const QModelIndex &parent)
{
    Q_ASSERT(m_model);
    qint32 rowCount, colCount;
    source >> rowCount >> colCount;
    m_model->insertRows(0, rowCount, parent);
    m_model->insertColumns(0, colCount, parent);
    if (m_model->rowCount(parent) != rowCount)
        return false;
    if (m_model->columnCount(parent) != colCount)
        return false;
    qint32 tempRole = -1;
    QVariant tempData;
    bool hasChild = false;
    for (int i = 0; i < rowCount && source.status() == QDataStream::Ok; ++i) {
        for (int j = 0; j < colCount && source.status() == QDataStream::Ok; ++j) {
            const QModelIndex currIdx = m_model->index(i, j, parent);
            for (source >> tempRole; tempRole != -1 && source.status() == QDataStream::Ok; source >> tempRole) {
                source >> tempData;
                if (source.status() != QDataStream::Ok)
                    break;
                m_model->setData(currIdx, tempData, tempRole);
            }
            if (source.status() == QDataStream::Ok)
                source >> hasChild;
            if (source.status() != QDataStream::Ok)
                break;
            if (hasChild) {
                if (!readBinaryElement(source, currIdx)) {
                    m_model->removeRows(0, rowCount, parent);
                    m_model->removeColumns(0, colCount, parent);
                    return false;
                }
            }
        }
    }
    if (source.status() != QDataStream::Ok) {
        m_model->removeRows(0, rowCount, parent);
        m_model->removeColumns(0, colCount, parent);
        return false;
    }
    return true;
}